

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::wdec16
               (unsigned_short l,unsigned_short h,unsigned_short *a,unsigned_short *b)

{
  unsigned_short uVar1;
  int aa;
  int bb;
  int d;
  int m;
  unsigned_short *b_local;
  unsigned_short *a_local;
  unsigned_short h_local;
  unsigned_short l_local;
  
  uVar1 = l - (short)((int)(uint)h >> 1);
  *b = uVar1;
  *a = h + uVar1 + 0x8000;
  return;
}

Assistant:

inline void
wdec16 (unsigned short  l, unsigned short  h,
        unsigned short &a, unsigned short &b)
{
    int m = l;
    int d = h;
    int bb = (m - (d >> 1)) & MOD_MASK;
    int aa = (d + bb - A_OFFSET) & MOD_MASK;
    b = bb;
    a = aa;
}